

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

void __thiscall
QPlainTextEditPrivate::append(QPlainTextEditPrivate *this,QString *text,TextFormat format)

{
  undefined1 uVar1;
  undefined1 uVar2;
  QPlainTextEdit *this_00;
  QPlainTextEditControl *pQVar3;
  QScrollBar *this_01;
  bool bVar4;
  int iVar5;
  int iVar6;
  QTextDocument *pQVar7;
  QObject *object;
  QPlainTextDocumentLayout *pQVar8;
  QWidgetData *pQVar9;
  long in_FS_OFFSET;
  double dVar10;
  qreal qVar11;
  QRect QVar12;
  QTextCursor cursor;
  double local_60;
  double local_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPlainTextEdit **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  pQVar7 = QWidgetTextControl::document((QWidgetTextControl *)this->control);
  object = (QObject *)QTextDocument::documentLayout();
  pQVar8 = QtPrivate::qobject_cast_helper<QPlainTextDocumentLayout*,QObject>(object);
  iVar5 = QTextDocument::maximumBlockCount();
  if (iVar5 != 0) {
    QTextDocument::setMaximumBlockCount((int)pQVar7);
  }
  pQVar9 = (this_00->super_QAbstractScrollArea).super_QFrame.super_QWidget.data;
  if ((short)pQVar9->widget_attributes < 0) {
    pQVar3 = this->control;
    QTextDocument::lastBlock();
    (**(code **)(*(long *)&pQVar3->super_QWidgetTextControl + 0x80))(&cursor,pQVar3,local_48);
    dVar10 = local_60 + local_50;
    qVar11 = verticalOffset(this);
    QVar12 = QWidget::rect((this->super_QAbstractScrollAreaPrivate).viewport);
    bVar4 = dVar10 - qVar11 <= (double)QVar12.y2.m_i.m_i;
    pQVar9 = (this_00->super_QAbstractScrollArea).super_QFrame.super_QWidget.data;
  }
  else {
    bVar4 = false;
  }
  if ((pQVar9->widget_attributes & 0x8000) == 0) {
    this->field_0x348 = this->field_0x348 | 2;
  }
  uVar1 = *(undefined1 *)(*(long *)&pQVar8->field_0x8 + 0xb9);
  *(undefined1 *)(*(long *)&pQVar8->field_0x8 + 0xb9) = 1;
  pQVar3 = this->control;
  if (format == PlainText) {
    QWidgetTextControl::appendPlainText((QWidgetTextControl *)pQVar3,text);
  }
  else if (format == RichText) {
    QWidgetTextControl::appendHtml((QWidgetTextControl *)pQVar3,text);
  }
  else {
    QWidgetTextControl::append((QWidgetTextControl *)pQVar3,text);
  }
  if (0 < iVar5) {
    iVar6 = QTextDocument::blockCount();
    if (iVar5 < iVar6) {
      iVar5 = this->control->topBlock;
      if (iVar5 != 0) {
        this->control->topBlock = iVar5 + -1;
        _cursor = QWidget::rect((this->super_QAbstractScrollAreaPrivate).viewport);
        QPlainTextEdit::updateRequest(this_00,(QRect *)&cursor,0);
      }
      uVar2 = *(undefined1 *)(*(long *)&pQVar8->field_0x8 + 0xb8);
      *(bool *)(*(long *)&pQVar8->field_0x8 + 0xb8) = iVar5 != 0;
      _cursor = &DAT_aaaaaaaaaaaaaaaa;
      QTextCursor::QTextCursor(&cursor,pQVar7);
      QTextCursor::movePosition((MoveOperation)&cursor,0x10,1);
      QTextCursor::removeSelectedText();
      *(undefined1 *)(*(long *)&pQVar8->field_0x8 + 0xb8) = uVar2;
      QTextCursor::~QTextCursor(&cursor);
    }
    QTextDocument::setMaximumBlockCount((int)pQVar7);
  }
  *(undefined1 *)(*(long *)&pQVar8->field_0x8 + 0xb9) = uVar1;
  adjustScrollbars(this);
  if (bVar4) {
    if ((this->field_0x348 & 8) != 0) {
      pQVar3 = this->control;
      QTextDocument::lastBlock();
      (**(code **)(*(long *)&pQVar3->super_QWidgetTextControl + 0x80))(&cursor,pQVar3,local_48);
      dVar10 = local_60 + local_50;
      qVar11 = verticalOffset(this);
      QVar12 = QWidget::rect((this->super_QAbstractScrollAreaPrivate).viewport);
      if (dVar10 - qVar11 <= (double)QVar12.y2.m_i.m_i) goto LAB_0045c48a;
    }
    this_01 = (this->super_QAbstractScrollAreaPrivate).vbar;
    iVar5 = QAbstractSlider::maximum(&this_01->super_QAbstractSlider);
    QAbstractSlider::setValue(&this_01->super_QAbstractSlider,iVar5);
  }
LAB_0045c48a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEditPrivate::append(const QString &text, Qt::TextFormat format)
{
    Q_Q(QPlainTextEdit);

    QTextDocument *document = control->document();
    QPlainTextDocumentLayout *documentLayout = qobject_cast<QPlainTextDocumentLayout*>(document->documentLayout());
    Q_ASSERT(documentLayout);

    int maximumBlockCount = document->maximumBlockCount();
    if (maximumBlockCount)
        document->setMaximumBlockCount(0);

    const bool atBottom =  q->isVisible()
                           && (control->blockBoundingRect(document->lastBlock()).bottom() - verticalOffset()
                               <= viewport->rect().bottom());

    if (!q->isVisible())
        showCursorOnInitialShow = true;

    bool documentSizeChangedBlocked = documentLayout->priv()->blockDocumentSizeChanged;
    documentLayout->priv()->blockDocumentSizeChanged = true;

    switch (format) {
    case Qt::RichText:
        control->appendHtml(text);
        break;
    case Qt::PlainText:
        control->appendPlainText(text);
        break;
    default:
        control->append(text);
        break;
    }

    if (maximumBlockCount > 0) {
        if (document->blockCount() > maximumBlockCount) {
            bool blockUpdate = false;
            if (control->topBlock) {
                control->topBlock--;
                blockUpdate = true;
                emit q->updateRequest(viewport->rect(), 0);
            }

            bool updatesBlocked = documentLayout->priv()->blockUpdate;
            documentLayout->priv()->blockUpdate = blockUpdate;
            QTextCursor cursor(document);
            cursor.movePosition(QTextCursor::NextBlock, QTextCursor::KeepAnchor);
            cursor.removeSelectedText();
            documentLayout->priv()->blockUpdate = updatesBlocked;
        }
        document->setMaximumBlockCount(maximumBlockCount);
    }

    documentLayout->priv()->blockDocumentSizeChanged = documentSizeChangedBlocked;
    adjustScrollbars();


    if (atBottom) {
        const bool needScroll =  !centerOnScroll
                                 || control->blockBoundingRect(document->lastBlock()).bottom() - verticalOffset()
                                 > viewport->rect().bottom();
        if (needScroll)
            vbar->setValue(vbar->maximum());
    }
}